

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O2

void trace_genrec_(Integer *ga,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *op)

{
  bool bVar1;
  Integer *pIVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  int *procs;
  int *map;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int ndim;
  FILE *local_b0;
  long *local_a8;
  int block [2];
  int dims [2];
  int type;
  int hi [2];
  int lo [2];
  char fname [15];
  
  local_a8 = ga;
  iVar4 = GA_Nodeid();
  uVar5 = GA_Nnodes();
  plVar3 = local_a8;
  if (current < MAX_EVENTS) {
    if (iVar4 == 0) {
      lVar6 = (long)ganum;
      uVar7 = 0;
      uVar11 = 0;
      if (0 < ganum) {
        uVar11 = (ulong)(uint)ganum;
      }
      bVar1 = false;
      for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        if (*local_a8 == (long)galog[uVar7]) {
          bVar1 = true;
        }
      }
      if (!bVar1) {
        ganum = ganum + 1;
        galog[lVar6] = (int)*local_a8;
        sprintf(fname,"distrib.%d");
        local_b0 = fopen(fname,"w");
        NGA_Inquire((int)*plVar3,&type,&ndim,dims);
        procs = (int *)malloc((long)(int)uVar5 * 4);
        if (procs == (int *)0x0) {
          GA_Error("malloc failed for proclist",0);
        }
        map = (int *)malloc((long)(int)uVar5 << 4);
        if (map == (int *)0x0) {
          GA_Error("malloc failed for regions",0);
        }
        uVar11 = 0;
        uVar7 = (ulong)(uint)ndim;
        if (ndim < 1) {
          uVar7 = uVar11;
        }
        for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          lo[uVar11] = 0;
          hi[uVar11] = dims[uVar11] + -1;
        }
        iVar4 = NGA_Locate_region((int)*local_a8,lo,hi,map,procs);
        if (iVar4 < 1) {
          GA_Error("error in NGA_Locate_region",iVar4);
        }
        uVar11 = 0;
        uVar7 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar7 = uVar11;
        }
        uVar8 = (ulong)(uint)ndim;
        if (ndim < 1) {
          uVar8 = uVar11;
        }
        piVar10 = map + 2;
        for (; uVar11 != uVar8; uVar11 = uVar11 + 1) {
          block[uVar11] = 0;
          iVar12 = 0;
          iVar4 = 0;
          for (lVar6 = 0; uVar7 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
            iVar13 = *(int *)((long)piVar10 + lVar6);
            if (iVar4 < iVar13) {
              iVar12 = iVar12 + 1;
              block[uVar11] = iVar12;
              iVar4 = iVar13;
            }
          }
          piVar10 = piVar10 + 1;
        }
        fprintf(local_b0,"%d\n",(ulong)uVar5);
        for (lVar6 = 0; lVar6 < ndim; lVar6 = lVar6 + 1) {
          fprintf(local_b0,"%d ",(ulong)(uint)dims[lVar6]);
        }
        fputc(10,local_b0);
        for (lVar6 = 0; lVar6 < ndim; lVar6 = lVar6 + 1) {
          uVar5 = block[lVar6] - 1;
          if (block[lVar6] == 1) {
            uVar5 = 1;
          }
          fprintf(local_b0,"%d ",(ulong)uVar5);
        }
        fputc(10,local_b0);
        piVar10 = map + 2;
        for (lVar6 = 0; lVar6 < ndim; lVar6 = lVar6 + 1) {
          iVar4 = block[lVar6];
          if (iVar4 == 1) {
            fprintf(local_b0,"%d\n",(ulong)(uint)dims[lVar6]);
          }
          else {
            iVar12 = 0;
            iVar13 = 0;
            for (lVar9 = 0; uVar7 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
              if (iVar12 < *(int *)((long)piVar10 + lVar9)) {
                iVar13 = iVar13 + 1;
                if (iVar13 == iVar4) break;
                fprintf(local_b0,"%d\n",(ulong)(*(int *)((long)piVar10 + lVar9) + 1));
                iVar12 = *(int *)((long)piVar10 + lVar9);
              }
            }
          }
          piVar10 = piVar10 + 1;
        }
        fclose(local_b0);
        free(map);
        free(procs);
      }
    }
    pIVar2 = tlog;
    uVar7 = (ulong)(tt0 * 1000000.0);
    tlog[current * 2] =
         (long)uVar7 >> 0x3f & (long)(tt0 * 1000000.0 - 9.223372036854776e+18) | uVar7;
    uVar7 = (ulong)(tt1 * 1000000.0);
    pIVar2[current * 2 + 1] =
         (long)uVar7 >> 0x3f & (long)(tt1 * 1000000.0 - 9.223372036854776e+18) | uVar7;
    pIVar2 = indlog;
    indlog[current * 6] = *local_a8;
    pIVar2[current * 6 + 1] = *ilo;
    pIVar2[current * 6 + 2] = *ihi;
    pIVar2[current * 6 + 3] = *jlo;
    pIVar2[current * 6 + 4] = *jhi;
    pIVar2[current * 6 + 5] = *op;
    current = current + 1;
  }
  return;
}

Assistant:

void trace_genrec_(Integer *ga, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi,
                   Integer *op)
{
    int i, d, has_record, counter;
    FILE *fout;
    char fname[15];
    typedef struct {
       int lo[2];
       int hi[2];
    } patch_t;
    patch_t *regions;
    int *proclist;
    int ndim, dims[2], tmp_dims[2], lo[2], hi[2], type, block[2];
    int me=GA_Nodeid(), nproc=GA_Nnodes(), proc;
    
    if(current >=  MAX_EVENTS) return;

    /* only node 0 does the bookkeeping */
    if(me == 0) {
        /* test if this ga has been recorded */
        has_record = 0;
        for(i=0; i<ganum; i++)
            if(*ga == (long) galog[i]) has_record = 1;

        if(!has_record) {
            galog[ganum++] = (int)*ga;
            
            sprintf(fname, "distrib.%d",(int) *ga);
            fout = fopen(fname,"w");
            
            NGA_Inquire((int)*ga, &type, &ndim, dims);
            
            /* get memory for arrays describing distribution */
            proclist = (int*)malloc(nproc*sizeof(int));
            if(!proclist)GA_Error("malloc failed for proclist",0);
            regions = (patch_t*)malloc(nproc*sizeof(patch_t));
            if(!regions)GA_Error("malloc failed for regions",0);

            for(d=0; d<ndim; d++) { lo[d] = 0; hi[d] = dims[d] -1;}

            proc = NGA_Locate_region((int)*ga, lo, hi, (int*)regions, proclist);
            if(proc<1) GA_Error("error in NGA_Locate_region",proc);
            
            for(d=0; d<ndim; d++) {
                tmp_dims[d] = 0; block[d] = 0;
                for(i=0; i<nproc; i++)
                    if(regions[i].hi[d] > tmp_dims[d]) {
                        block[d]++;
                        tmp_dims[d] = regions[i].hi[d];
                    }
            }

            /* print the number of processed */
            fprintf(fout, "%d\n", nproc);
            /* print dimensions */
            for(d=0; d<ndim; d++) fprintf(fout, "%d ", dims[d]);
            fprintf(fout, "\n");

            /* print number of lines to draw for each dimension */
            for(d=0; d<ndim; d++) 
                if(block[d] == 1) fprintf(fout, "%d ", block[d]);
                else fprintf(fout, "%d ", block[d]-1);
            fprintf(fout, "\n");

            /* print the offset for each line */
            for(d=0; d<ndim; d++) {
                if(block[d] == 1) fprintf(fout, "%d\n", dims[d]);
                else {
                    tmp_dims[d] = 0;
                    counter = 0;
                    for(i=0; i<nproc; i++)
                        if(regions[i].hi[d] > tmp_dims[d]) {
                            counter++;
                            if(counter == block[d]) break;
                            fprintf(fout, "%d\n",
                                    regions[i].hi[d]+1);
                            tmp_dims[d] = regions[i].hi[d];
                        }
                }
            }
            fclose(fout);
            free(regions); free(proclist);
        }
    }

    tlog[current*2]     = (unsigned long)(tt0 * 1000000);
    tlog[current*2+1]   = (unsigned long)(tt1 * 1000000);
    indlog[current*6]   = *ga;
    indlog[current*6+1] = *ilo;
    indlog[current*6+2] = *ihi;
    indlog[current*6+3] = *jlo;
    indlog[current*6+4] = *jhi;
    indlog[current*6+5] = *op;
    current++;
}